

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O1

int __thiscall ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  iVar4 = bottom_blob->h;
  iVar5 = bottom_blob->c;
  uVar6 = iVar5 / this->group;
  iVar7 = -100;
  if (iVar5 == this->group * uVar6) {
    iVar1 = bottom_blob->w;
    uVar2 = bottom_blob->elemsize;
    auVar13._0_4_ = -(uint)(DAT_0013323c._4_4_ == top_blob->dims);
    auVar13._4_4_ = -(uint)(iVar1 == top_blob->w);
    auVar13._8_4_ = -(uint)(iVar4 == top_blob->h);
    auVar13._12_4_ = -(uint)(iVar5 == top_blob->c);
    iVar7 = movmskps(uVar6,auVar13);
    if ((iVar7 != 0xf) || (top_blob->elemsize != uVar2)) {
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = uVar2;
      top_blob->dims = 3;
      top_blob->w = iVar1;
      top_blob->h = iVar4;
      top_blob->c = iVar5;
      uVar8 = ((long)(iVar4 * iVar1) * uVar2 + 0xf & 0xfffffffffffffff0) / uVar2;
      top_blob->cstep = uVar8;
      lVar12 = (long)iVar5 * uVar8;
      if (lVar12 != 0) {
        lVar12 = lVar12 * uVar2;
        pvVar9 = malloc(lVar12 + 0x1c);
        pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar10 - 8) = pvVar9;
        top_blob->data = pvVar10;
        top_blob->refcount = (int *)((long)pvVar10 + lVar12);
        *(undefined4 *)((long)pvVar10 + lVar12) = 1;
      }
    }
    iVar7 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (this->group != 0) {
        lVar12 = 0;
        uVar8 = 0;
        do {
          if (uVar6 != 0) {
            uVar11 = 0;
            do {
              memcpy((void *)(((long)(int)uVar11 * (long)this->group + uVar8) * top_blob->cstep *
                              top_blob->elemsize + (long)top_blob->data),
                     (void *)((lVar12 + uVar11) * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data),uVar2 * (long)(iVar4 * iVar1));
              uVar11 = uVar11 + 1;
            } while (uVar6 != uVar11);
          }
          uVar8 = uVar8 + 1;
          lVar12 = lVar12 + (int)uVar6;
        } while (uVar8 != (uint)this->group);
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}